

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file_dictionary_handler.c
# Opt level: O0

ion_err_t ffdict_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_dictionary_parent_t *piVar1;
  ion_err_t result;
  ion_dictionary_compare_t compare_local;
  ion_dictionary_size_t dictionary_size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_id_t id_local;
  
  piVar1 = (ion_dictionary_parent_t *)malloc(0x68);
  dictionary->instance = piVar1;
  if (dictionary->instance == (ion_dictionary_parent_t *)0x0) {
    key_type_local._3_1_ = 6;
  }
  else {
    dictionary->instance->compare = compare;
    dictionary->instance->type = dictionary_type_flat_file_t;
    key_type_local._3_1_ =
         flat_file_initialize
                   ((ion_flat_file_t *)dictionary->instance,id,key_type,key_size,value_size,
                    dictionary_size);
    if ((key_type_local._3_1_ == key_type_numeric_signed >> 0x18) &&
       (handler != (ion_dictionary_handler_t *)0x0)) {
      dictionary->handler = handler;
    }
  }
  return key_type_local._3_1_;
}

Assistant:

ion_err_t
ffdict_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	dictionary->instance = malloc(sizeof(ion_flat_file_t));

	if (NULL == dictionary->instance) {
		return err_out_of_memory;
	}

	dictionary->instance->compare	= compare;
	dictionary->instance->type		= dictionary_type_flat_file_t;

	ion_err_t result = flat_file_initialize((ion_flat_file_t *) dictionary->instance, id, key_type, key_size, value_size, dictionary_size);

	if ((err_ok == result) && (NULL != handler)) {
		dictionary->handler = handler;
	}

	return result;
}